

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>_>
            *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_f8;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_e8;
  value_type local_d8;
  value_type local_b8;
  value_type local_98;
  value_type local_78;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_58;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_48;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_38;
  
  pFVar1 = (this->left_->dx_).ptr_to_data;
  FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_78,&this->right_->fadexpr_);
  local_f8.fadexpr_.left_ = pFVar1 + i;
  local_f8.fadexpr_.right_ = &local_78;
  FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_98,&this->right_->fadexpr_,i);
  local_48.fadexpr_.right_ = &this->left_->val_;
  local_e8.fadexpr_.right_ = &local_48;
  local_e8.fadexpr_.left_ = &local_f8;
  local_48.fadexpr_.left_ = &local_98;
  FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_b8,&this->right_->fadexpr_);
  FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_d8,&this->right_->fadexpr_);
  local_38.fadexpr_.right_ = &local_58;
  local_38.fadexpr_.left_ = &local_e8;
  local_58.fadexpr_.left_ = &local_b8;
  local_58.fadexpr_.right_ = &local_d8;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_d8);
  Fad<double>::~Fad(&local_b8);
  Fad<double>::~Fad(&local_98);
  Fad<double>::~Fad(&local_78);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}